

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::primary_expr(analysis *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TYPE TVar4;
  int iVar5;
  TreeNode *__tmp_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  analysis *in_RSI;
  TreeNode *__tmp_2;
  TreeNode *__tmp;
  float fVar7;
  NodePtr NVar8;
  int lineno;
  int tmp_int;
  string tmp_str;
  undefined1 local_11d;
  int local_11c;
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  pointer local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_11c = token::getLineno((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == NUMINT) {
    iVar5 = numberInteger(in_RSI);
    local_118._0_4_ = iVar5;
    local_f0._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,int&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8),(TreeNode **)local_f0,
               (allocator<dh::TreeNode> *)&local_11d,(int *)local_118,&local_11c);
    uVar1 = local_f0._0_8_;
    this->layer_record = local_f0._0_4_;
    this->initFlag = (bool)local_f0[4];
    *(undefined3 *)&this->field_0x5 = local_f0._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f0._8_8_;
    local_f0._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar1,(int *)local_f0);
    local_f0._0_4_ = 0xb;
    TreeNode::setKind((TreeNode *)uVar1,(int *)local_f0);
    local_f0._0_4_ = 2;
    TreeNode::setType((TreeNode *)uVar1,(int *)local_f0);
    _Var6._M_pi = extraout_RDX;
    goto LAB_00116e9b;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == NUMFLOAT) {
    fVar7 = numberFloat(in_RSI);
    local_118._0_4_ = fVar7;
    local_f0._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,float&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8),(TreeNode **)local_f0,
               (allocator<dh::TreeNode> *)&local_11d,(float *)local_118,&local_11c);
    uVar1 = local_f0._0_8_;
    this->layer_record = local_f0._0_4_;
    this->initFlag = (bool)local_f0[4];
    *(undefined3 *)&this->field_0x5 = local_f0._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f0._8_8_;
    local_f0._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar1,(int *)local_f0);
    local_f0._0_4_ = 0xc;
    TreeNode::setKind((TreeNode *)uVar1,(int *)local_f0);
    local_f0._0_4_ = 3;
    TreeNode::setType((TreeNode *)uVar1,(int *)local_f0);
    _Var6._M_pi = extraout_RDX_00;
    goto LAB_00116e9b;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if ((TVar4 == NUMBOOLEAN) ||
     (TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr), TVar4 == STRING)) {
    token::getVal_abi_cxx11_
              ((string *)local_f0,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_118._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
               (allocator<dh::TreeNode> *)&local_11d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               &local_11c);
    uVar3 = local_118._8_8_;
    uVar1 = local_118._0_8_;
    local_118._0_8_ = (TreeNode *)0x0;
    uVar2 = local_118._0_8_;
    local_118._8_8_ = (element_type *)0x0;
    local_118._0_4_ = (undefined4)uVar1;
    local_118[4] = SUB81(uVar1,4);
    local_118._5_3_ = SUB83(uVar1,5);
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    local_118._0_8_ = uVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_);
    }
    TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar4 == NUMBOOLEAN) {
      local_f0._0_8_ = (ulong)(uint)local_f0._4_4_ << 0x20;
      TreeNode::setType((TreeNode *)uVar1,(int *)local_f0);
      local_f0._0_4_ = 0xd;
      TreeNode::setKind((TreeNode *)uVar1,(int *)local_f0);
    }
    else {
      local_f0._0_4_ = 1;
      TreeNode::setType((TreeNode *)uVar1,(int *)local_f0);
      local_f0._0_4_ = 0xe;
      TreeNode::setKind((TreeNode *)uVar1,(int *)local_f0);
    }
    token::getVal_abi_cxx11_
              (&local_50,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_f0._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar1,(int *)local_f0);
    _Var6._M_pi = extraout_RDX_01;
    goto LAB_00116e9b;
  }
  TVar4 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar4 == ID) {
    identifier_abi_cxx11_((string *)local_f0,in_RSI);
    local_118._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
               (allocator<dh::TreeNode> *)&local_11d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               &local_11c);
    uVar1 = local_118._0_8_;
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_118._8_8_;
    local_118._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar1,(int *)local_118);
    token::getVal_abi_cxx11_
              ((string *)local_118,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar5 = std::__cxx11::string::compare(local_118);
    if ((TreeNode *)local_118._0_8_ != (TreeNode *)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_);
    }
    if (iVar5 == 0) {
      local_60._M_allocated_capacity._0_2_ = 0x5b;
      local_70._8_8_ = (pointer)0x1;
      local_70._M_allocated_capacity = (size_type)&local_60;
      match(in_RSI,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity != &local_60) {
        operator_delete((void *)local_70._M_allocated_capacity);
      }
      local_118._0_4_ = 8;
      TreeNode::setKind((TreeNode *)uVar1,(int *)local_118);
      assignment_expr((analysis *)local_118);
      local_90._16_2_ = 0x5d;
      local_90._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_90._0_8_ = (pointer)(local_90 + 0x10);
      match(in_RSI,(string *)local_90);
      if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_);
      }
      TreeNode::appendChild((TreeNode *)uVar1,(NodePtr *)local_118);
      _Var6._M_pi = extraout_RDX_04;
LAB_0011710c:
      if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        _Var6._M_pi = extraout_RDX_06;
      }
    }
    else {
      token::getVal_abi_cxx11_
                ((string *)local_118,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar5 = std::__cxx11::string::compare(local_118);
      if ((TreeNode *)local_118._0_8_ != (TreeNode *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_);
      }
      if (iVar5 == 0) {
        local_118._0_4_ = 9;
        TreeNode::setKind((TreeNode *)uVar1,(int *)local_118);
        arg_list((analysis *)local_118);
        TreeNode::appendChild((TreeNode *)uVar1,(NodePtr *)local_118);
        _Var6._M_pi = extraout_RDX_05;
        goto LAB_0011710c;
      }
      local_118._0_4_ = 0xf;
      TreeNode::setKind((TreeNode *)uVar1,(int *)local_118);
      _Var6._M_pi = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_f0 + 0x10)) goto LAB_00116e9b;
  }
  else {
    local_b0.field_2._0_2_ = 0x28;
    local_b0._M_string_length = 1;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    match(in_RSI,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    assignment_expr((analysis *)local_f0);
    this->layer_record = local_f0._0_4_;
    this->initFlag = (bool)local_f0[4];
    *(undefined3 *)&this->field_0x5 = local_f0._5_3_;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_f0._8_8_;
    local_c0._M_allocated_capacity._0_2_ = 0x29;
    local_c8 = (pointer)0x1;
    local_f0._32_8_ = &local_c0;
    match(in_RSI,(string *)(local_f0 + 0x20));
    _Var6._M_pi = extraout_RDX_03;
    local_f0._0_8_ = local_f0._32_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._32_8_ == &local_c0) goto LAB_00116e9b;
  }
  operator_delete((void *)local_f0._0_8_);
  _Var6._M_pi = extraout_RDX_07;
LAB_00116e9b:
  NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::primary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in primary_expr\n";
#endif
	NodePtr ret;

	int lineno = tmp->getLineno();
	if ( tmp->getType() == TYPE::NUMINT)
	{
		int tmp_int = numberInteger();
		ret = ::std::make_shared<TreeNode>(tmp_int,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::INTLITERAL);
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getType() == TYPE::NUMFLOAT)
	{
		float tmp_float = numberFloat();
		ret = ::std::make_shared<TreeNode>(tmp_float,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::FLOATLITERAL);
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getType() == TYPE::NUMBOOLEAN || tmp->getType() == TYPE::STRING)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),lineno);

		if ( tmp->getType() == TYPE::NUMBOOLEAN){
			ret->setType(TypeKind::BoolK);
			ret->setKind(ExprKind::BOOLLITERAL);
		} else 
		{
			ret->setType(TypeKind::StringK);
			ret->setKind(ExprKind::STRINGLITERAL);
		}
		match(tmp->getVal());
		ret->setNodeKind(NodeKind::ExprK);
	} else if ( tmp->getType() == TYPE::ID)
	{
		::std::string tmp_str = identifier();

		ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
		ret->setNodeKind(NodeKind::ExprK);

		if ( tmp->getVal() == "[")
		{
			match("[");
			ret->setKind(ExprKind::ArrayExp);
			NodePtr tmp_ptr = expr();
			match("]");
			ret->appendChild(tmp_ptr);
		} else if ( tmp->getVal() == "(")
		{
			ret->setKind(ExprKind::FuncExp);
			NodePtr tmp_ptr = arg_list();
			ret->appendChild(tmp_ptr);
		} else 
		{
			ret->setKind(ExprKind::IdK);
		}
	} else 
	{
		match("(");
		ret = expr();
		match(")");
	}

	return ret;
}